

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<Fad<double>_>::resize(Vector<Fad<double>_> *this,int ssize)

{
  long *plVar1;
  Fad<double> *this_00;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (ssize == 0) {
    if (this->num_elts != 0) {
      destroy(this);
      return;
    }
  }
  else {
    if (this->num_elts != 0) {
      destroy(this);
    }
    this->num_elts = ssize;
    lVar4 = (long)ssize * 0x20;
    uVar3 = 0xffffffffffffffff;
    if (-1 < ssize) {
      uVar3 = lVar4 + 8;
    }
    plVar1 = (long *)operator_new__(uVar3);
    *plVar1 = (long)ssize;
    lVar2 = 0;
    this_00 = (Fad<double> *)(plVar1 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar2 = lVar2 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar2 != lVar4);
    this->ptr_to_data = (Fad<double> *)(plVar1 + 1);
  }
  return;
}

Assistant:

inline void Vector< T >::resize(int ssize)
{
#ifdef CHECK_SIZE
    if ( ssize <0 ) error("Vector<>::reserve(), negative size");
#endif

    if ( ssize != 0){
      if ( num_elts != 0) destroy();

      num_elts = ssize;
      ptr_to_data = new T[num_elts];              
      
      if ( ptr_to_data == 0 ) error("Vector<>::reserve(), not enough memory");

    }
    else
      if ( num_elts != 0) destroy();

#ifdef DEBUG
    fprintf(stderr,"Vector<>::reserve()         |                   | adr =  %x \n", ptr_to_data);
#endif
}